

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int fy_node_hash_uint(fy_node *fyn,uint *hashp)

{
  uint uVar1;
  void *state_00;
  XXH32_state_t state;
  XXH32_state_t XStack_48;
  
  XXH32_reset(&XStack_48,0x9e3779b1);
  fy_node_hash_internal(fyn,(fy_hash_update_fn)&XStack_48,state_00);
  uVar1 = XXH32_digest(&XStack_48);
  *hashp = uVar1;
  return 0;
}

Assistant:

int fy_node_hash_uint(struct fy_node *fyn, unsigned int *hashp) {
    XXH32_state_t state;
    int rc;

    XXH32_reset(&state, 2654435761U);

    rc = fy_node_hash_internal(fyn, update_xx32, &state);
    if (rc)
        return rc;

    *hashp = XXH32_digest(&state);
    return 0;
}